

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::GenerateBlockSyntax::setChild
          (GenerateBlockSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00509c6c + *(int *)(&DAT_00509c6c + index * 4)))();
  return;
}

Assistant:

void GenerateBlockSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 2: begin = child.token(); return;
        case 3: beginName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        case 4: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 5: end = child.token(); return;
        case 6: endName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}